

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O0

bool __thiscall
wasm::SimplifyLocals<true,_true,_true>::runMainOptimizations
          (SimplifyLocals<true,_true,_true> *this,Function *func)

{
  Block *pBVar1;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  optional<wasm::Type> type_01;
  bool bVar2;
  size_type sVar3;
  reference ppBVar4;
  reference ppIVar5;
  ExpressionList *pEVar6;
  reference ppLVar7;
  Module *pMVar8;
  size_t sVar9;
  Expression **ppEVar10;
  Expression *pEVar11;
  _Storage<wasm::Type,_true> local_118;
  undefined8 local_110;
  string_view local_108;
  Builder local_f8;
  Block *local_f0;
  Block *block_1;
  Loop *loop;
  iterator __end3_2;
  iterator __begin3_2;
  vector<wasm::Loop_*,_std::allocator<wasm::Loop_*>_> *__range3_2;
  _Storage<wasm::Type,_true> local_c0;
  undefined8 local_b8;
  string_view local_b0;
  Builder local_a0;
  Block *local_98;
  Block *ifFalse;
  _Storage<wasm::Type,_true> local_88;
  undefined8 local_80;
  string_view local_78;
  Builder local_68;
  Block *local_60;
  Block *ifTrue;
  If *iff;
  iterator __end3_1;
  iterator __begin3_1;
  vector<wasm::If_*,_std::allocator<wasm::If_*>_> *__range3_1;
  Block *block;
  iterator __end3;
  iterator __begin3;
  vector<wasm::Block_*,_std::allocator<wasm::Block_*>_> *__range3;
  Function *func_local;
  SimplifyLocals<true,_true,_true> *this_local;
  
  this->anotherCycle = false;
  Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
  ::doWalkFunction((Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                    *)&(this->
                       super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                       ).
                       super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                   ,func);
  sVar3 = std::vector<wasm::Block_*,_std::allocator<wasm::Block_*>_>::size(&this->blocksToEnlarge);
  if (sVar3 != 0) {
    __end3 = std::vector<wasm::Block_*,_std::allocator<wasm::Block_*>_>::begin
                       (&this->blocksToEnlarge);
    block = (Block *)std::vector<wasm::Block_*,_std::allocator<wasm::Block_*>_>::end
                               (&this->blocksToEnlarge);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<wasm::Block_**,_std::vector<wasm::Block_*,_std::allocator<wasm::Block_*>_>_>
                                       *)&block), bVar2) {
      ppBVar4 = __gnu_cxx::
                __normal_iterator<wasm::Block_**,_std::vector<wasm::Block_*,_std::allocator<wasm::Block_*>_>_>
                ::operator*(&__end3);
      pBVar1 = *ppBVar4;
      pMVar8 = Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
               ::getModule((Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                            *)&(this->
                               super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                               ).
                               super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                          );
      pEVar11 = (Expression *)MixedArena::alloc<wasm::Nop>(&pMVar8->allocator);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&(pBVar1->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,pEVar11
                );
      __gnu_cxx::
      __normal_iterator<wasm::Block_**,_std::vector<wasm::Block_*,_std::allocator<wasm::Block_*>_>_>
      ::operator++(&__end3);
    }
    std::vector<wasm::Block_*,_std::allocator<wasm::Block_*>_>::clear(&this->blocksToEnlarge);
    this->anotherCycle = true;
  }
  sVar3 = std::vector<wasm::If_*,_std::allocator<wasm::If_*>_>::size(&this->ifsToEnlarge);
  if (sVar3 != 0) {
    __end3_1 = std::vector<wasm::If_*,_std::allocator<wasm::If_*>_>::begin(&this->ifsToEnlarge);
    iff = (If *)std::vector<wasm::If_*,_std::allocator<wasm::If_*>_>::end(&this->ifsToEnlarge);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3_1,
                              (__normal_iterator<wasm::If_**,_std::vector<wasm::If_*,_std::allocator<wasm::If_*>_>_>
                               *)&iff), bVar2) {
      ppIVar5 = __gnu_cxx::
                __normal_iterator<wasm::If_**,_std::vector<wasm::If_*,_std::allocator<wasm::If_*>_>_>
                ::operator*(&__end3_1);
      ifTrue = (Block *)*ppIVar5;
      pMVar8 = Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
               ::getModule((Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                            *)&(this->
                               super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                               ).
                               super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                          );
      Builder::Builder(&local_68,pMVar8);
      pEVar11 = (Expression *)(ifTrue->name).super_IString.str._M_str;
      wasm::Name::Name((Name *)&local_78);
      std::optional<wasm::Type>::optional((optional<wasm::Type> *)&local_88);
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = local_80;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = local_88;
      local_60 = Builder::blockifyWithName(&local_68,pEVar11,(Name)local_78,(Expression *)0x0,type);
      (ifTrue->name).super_IString.str._M_str = (char *)local_60;
      sVar9 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                        (&(local_60->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
      if (sVar9 == 0) {
LAB_02227cde:
        pEVar6 = &local_60->list;
        pMVar8 = Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                 ::getModule((Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                              *)&(this->
                                 super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                                 ).
                                 super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                            );
        pEVar11 = (Expression *)MixedArena::alloc<wasm::Nop>(&pMVar8->allocator);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&pEVar6->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   pEVar11);
      }
      else {
        ppEVar10 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                             (&(local_60->list).
                               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             );
        bVar2 = Expression::is<wasm::Nop>(*ppEVar10);
        if (!bVar2) goto LAB_02227cde;
      }
      if ((ifTrue->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
          data != (Expression **)0x0) {
        pMVar8 = Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                 ::getModule((Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                              *)&(this->
                                 super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                                 ).
                                 super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                            );
        Builder::Builder(&local_a0,pMVar8);
        pEVar11 = (Expression *)
                  (ifTrue->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data;
        wasm::Name::Name((Name *)&local_b0);
        std::optional<wasm::Type>::optional((optional<wasm::Type> *)&local_c0);
        type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = local_b8;
        type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload = local_c0;
        local_98 = Builder::blockifyWithName
                             (&local_a0,pEVar11,(Name)local_b0,(Expression *)0x0,type_00);
        (ifTrue->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
        data = (Expression **)local_98;
        sVar9 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                          (&(local_98->list).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          );
        if (sVar9 != 0) {
          ppEVar10 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                               (&(local_98->list).
                                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               );
          bVar2 = Expression::is<wasm::Nop>(*ppEVar10);
          if (bVar2) goto LAB_02227e37;
        }
        pEVar6 = &local_98->list;
        pMVar8 = Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                 ::getModule((Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                              *)&(this->
                                 super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                                 ).
                                 super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                            );
        pEVar11 = (Expression *)MixedArena::alloc<wasm::Nop>(&pMVar8->allocator);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&pEVar6->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   pEVar11);
      }
LAB_02227e37:
      __gnu_cxx::
      __normal_iterator<wasm::If_**,_std::vector<wasm::If_*,_std::allocator<wasm::If_*>_>_>::
      operator++(&__end3_1);
    }
    std::vector<wasm::If_*,_std::allocator<wasm::If_*>_>::clear(&this->ifsToEnlarge);
    this->anotherCycle = true;
  }
  sVar3 = std::vector<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>::size(&this->loopsToEnlarge);
  if (sVar3 != 0) {
    __end3_2 = std::vector<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>::begin
                         (&this->loopsToEnlarge);
    loop = (Loop *)std::vector<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>::end
                             (&this->loopsToEnlarge);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3_2,
                              (__normal_iterator<wasm::Loop_**,_std::vector<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>_>
                               *)&loop), bVar2) {
      ppLVar7 = __gnu_cxx::
                __normal_iterator<wasm::Loop_**,_std::vector<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>_>
                ::operator*(&__end3_2);
      block_1 = (Block *)*ppLVar7;
      pMVar8 = Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
               ::getModule((Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                            *)&(this->
                               super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                               ).
                               super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                          );
      Builder::Builder(&local_f8,pMVar8);
      pEVar11 = (Expression *)
                (block_1->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data;
      wasm::Name::Name((Name *)&local_108);
      std::optional<wasm::Type>::optional((optional<wasm::Type> *)&local_118);
      type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = local_110;
      type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = local_118;
      local_f0 = Builder::blockifyWithName
                           (&local_f8,pEVar11,(Name)local_108,(Expression *)0x0,type_01);
      (block_1->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      data = (Expression **)local_f0;
      sVar9 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                        (&(local_f0->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
      if (sVar9 == 0) {
LAB_02227fc2:
        pEVar6 = &local_f0->list;
        pMVar8 = Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                 ::getModule((Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                              *)&(this->
                                 super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                                 ).
                                 super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                            );
        pEVar11 = (Expression *)MixedArena::alloc<wasm::Nop>(&pMVar8->allocator);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&pEVar6->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   pEVar11);
      }
      else {
        ppEVar10 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                             (&(local_f0->list).
                               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             );
        bVar2 = Expression::is<wasm::Nop>(*ppEVar10);
        if (!bVar2) goto LAB_02227fc2;
      }
      __gnu_cxx::
      __normal_iterator<wasm::Loop_**,_std::vector<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>_>::
      operator++(&__end3_2);
    }
    std::vector<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>::clear(&this->loopsToEnlarge);
    this->anotherCycle = true;
  }
  std::
  map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
  ::clear(&this->sinkables);
  std::
  map<wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>_>_>_>
  ::clear(&this->blockBreaks);
  std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::clear
            (&this->unoptimizableBlocks);
  return (bool)(this->anotherCycle & 1);
}

Assistant:

bool runMainOptimizations(Function* func) {
    anotherCycle = false;
    WalkerPass<LinearExecutionWalker<
      SimplifyLocals<allowTee, allowStructure, allowNesting>>>::
      doWalkFunction(func);
    // enlarge blocks that were marked, for the next round
    if (blocksToEnlarge.size() > 0) {
      for (auto* block : blocksToEnlarge) {
        block->list.push_back(
          this->getModule()->allocator.template alloc<Nop>());
      }
      blocksToEnlarge.clear();
      anotherCycle = true;
    }
    // enlarge ifs that were marked, for the next round
    if (ifsToEnlarge.size() > 0) {
      for (auto* iff : ifsToEnlarge) {
        auto ifTrue =
          Builder(*this->getModule()).blockifyWithName(iff->ifTrue, Name());
        iff->ifTrue = ifTrue;
        if (ifTrue->list.size() == 0 ||
            !ifTrue->list.back()->template is<Nop>()) {
          ifTrue->list.push_back(
            this->getModule()->allocator.template alloc<Nop>());
        }
        if (iff->ifFalse) {
          auto ifFalse =
            Builder(*this->getModule()).blockifyWithName(iff->ifFalse, Name());
          iff->ifFalse = ifFalse;
          if (ifFalse->list.size() == 0 ||
              !ifFalse->list.back()->template is<Nop>()) {
            ifFalse->list.push_back(
              this->getModule()->allocator.template alloc<Nop>());
          }
        }
      }
      ifsToEnlarge.clear();
      anotherCycle = true;
    }
    // enlarge loops that were marked, for the next round
    if (loopsToEnlarge.size() > 0) {
      for (auto* loop : loopsToEnlarge) {
        auto block =
          Builder(*this->getModule()).blockifyWithName(loop->body, Name());
        loop->body = block;
        if (block->list.size() == 0 ||
            !block->list.back()->template is<Nop>()) {
          block->list.push_back(
            this->getModule()->allocator.template alloc<Nop>());
        }
      }
      loopsToEnlarge.clear();
      anotherCycle = true;
    }
    // clean up
    sinkables.clear();
    blockBreaks.clear();
    unoptimizableBlocks.clear();
    return anotherCycle;
  }